

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchFunc.cpp
# Opt level: O2

void Bmatch_PIInformation(Abc_Frame_t *pAbc)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  char *pcVar6;
  int r;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int u;
  ulong uVar12;
  int i;
  long lVar13;
  ulong uVar14;
  int j;
  long lVar15;
  int i_1;
  long lVar16;
  
  pvVar1 = pAbc->pInformation;
  lVar11 = *(long *)((long)pvVar1 + 0x50);
  lVar15 = *(long *)((long)pvVar1 + 0x58);
  lVar2 = lVar15 - lVar11 >> 3;
  pvVar3 = operator_new__(lVar2 + 1);
  lVar16 = *(long *)((long)pvVar1 + 0x68);
  lVar13 = *(long *)((long)pvVar1 + 0x70) - lVar16 >> 3;
  pvVar4 = operator_new__(lVar13 + 1);
  *(undefined1 *)((long)pvVar3 + lVar2) = 0;
  *(undefined1 *)((long)pvVar4 + lVar13) = 0;
  uVar14 = 0;
LAB_0063cd58:
  if (uVar14 < (ulong)(lVar15 - lVar11 >> 3)) {
    Abc_ObjName(*(Abc_Obj_t **)(*(long *)(lVar11 + uVar14 * 8) + 8));
    printf("%6s:                              ");
  }
  else {
    if ((ulong)(*(long *)((long)pvVar1 + 0x70) - lVar16 >> 3) <= uVar14) {
      operator_delete__(pvVar3);
      operator_delete__(pvVar4);
      puts("PI supp information for two circuits : ");
      puts("  cir1   supp     cir2   supp   ");
      uVar14 = 0;
      uVar9 = 0;
      uVar10 = 0;
      do {
        if (uVar14 < (ulong)(*(long *)((long)pvVar1 + 0x88) - *(long *)((long)pvVar1 + 0x80) >> 3))
        {
          piVar7 = *(int **)(*(long *)((long)pvVar1 + 0x80) + uVar14 * 8);
          uVar10 = uVar10 + *piVar7;
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(piVar7 + 2));
          printf("%6s%7d   ",pcVar6,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x80) + uVar14 * 8))
          ;
        }
        else {
          if ((ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3) <=
              uVar14) {
            printf(" total %6d    total %6d   \n",(ulong)uVar10,(ulong)uVar9);
            return;
          }
          printf("                ");
        }
        if (uVar14 < (ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3))
        {
          piVar7 = *(int **)(*(long *)((long)pvVar1 + 0x98) + uVar14 * 8);
          uVar9 = uVar9 + *piVar7;
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(piVar7 + 2));
          printf("%6s%7d",pcVar6,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x98) + uVar14 * 8));
        }
        else {
          printf("             ");
        }
        putchar(10);
        uVar14 = uVar14 + 1;
      } while( true );
    }
    printf("                                     ");
  }
  if (uVar14 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3)) {
    Abc_ObjName(*(Abc_Obj_t **)(*(long *)(*(long *)((long)pvVar1 + 0x68) + uVar14 * 8) + 8));
    printf("%6s:");
  }
  else {
    printf("       ");
  }
  putchar(10);
  lVar15 = 0;
  do {
    lVar11 = *(long *)((long)pvVar1 + 0x50);
    piVar7 = *(int **)(lVar11 + uVar14 * 8);
    if (lVar15 < *piVar7) {
      uVar5 = *(long *)((long)pvVar1 + 0x58) - lVar11 >> 3;
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        for (uVar12 = 0; lVar16 = *(long *)(*(long *)(piVar7 + 4) + lVar15 * 8),
            lVar2 = *(long *)(lVar16 + 0x10),
            uVar12 < (ulong)(*(long *)(lVar16 + 0x18) - lVar2 >> 3); uVar12 = uVar12 + 1) {
          if (*(long *)(lVar2 + uVar12 * 8) == *(long *)(lVar11 + uVar8 * 8)) {
            *(undefined1 *)((long)pvVar3 + uVar8) = 0x31;
            piVar7 = *(int **)(lVar11 + uVar14 * 8);
          }
        }
      }
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        if (*(char *)((long)pvVar3 + uVar8) != '1') {
          *(undefined1 *)((long)pvVar3 + uVar8) = 0x30;
        }
      }
      printf("        %28s");
      lVar11 = *(long *)((long)pvVar1 + 0x58);
      lVar16 = *(long *)((long)pvVar1 + 0x50);
      for (uVar5 = 0; uVar5 < (ulong)(lVar11 - lVar16 >> 3); uVar5 = uVar5 + 1) {
        *(undefined1 *)((long)pvVar3 + uVar5) = 0x30;
      }
    }
    else {
      lVar16 = *(long *)((long)pvVar1 + 0x68);
      if (**(int **)(lVar16 + uVar14 * 8) <= lVar15) break;
      printf("                                    ");
    }
    lVar11 = *(long *)((long)pvVar1 + 0x68);
    piVar7 = *(int **)(lVar11 + uVar14 * 8);
    if (lVar15 < *piVar7) {
      uVar5 = *(long *)((long)pvVar1 + 0x70) - lVar11 >> 3;
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        for (uVar12 = 0; lVar16 = *(long *)(*(long *)(piVar7 + 4) + lVar15 * 8),
            lVar2 = *(long *)(lVar16 + 0x10),
            uVar12 < (ulong)(*(long *)(lVar16 + 0x18) - lVar2 >> 3); uVar12 = uVar12 + 1) {
          if (*(long *)(lVar2 + uVar12 * 8) == *(long *)(lVar11 + uVar8 * 8)) {
            *(undefined1 *)((long)pvVar4 + uVar8) = 0x31;
            piVar7 = *(int **)(lVar11 + uVar14 * 8);
          }
        }
      }
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        if (*(char *)((long)pvVar4 + uVar8) != '1') {
          *(undefined1 *)((long)pvVar4 + uVar8) = 0x30;
        }
      }
      printf("        %28s");
      lVar11 = *(long *)((long)pvVar1 + 0x70);
      lVar16 = *(long *)((long)pvVar1 + 0x68);
      for (uVar5 = 0; uVar5 < (ulong)(lVar11 - lVar16 >> 3); uVar5 = uVar5 + 1) {
        *(undefined1 *)((long)pvVar4 + uVar5) = 0x30;
      }
    }
    putchar(10);
    lVar15 = lVar15 + 1;
  } while( true );
  uVar14 = uVar14 + 1;
  lVar15 = *(long *)((long)pvVar1 + 0x58);
  goto LAB_0063cd58;
}

Assistant:

void Bmatch_PIInformation ( Abc_Frame_t * pAbc )
{
    int total1 = 0, total2 = 0;
    PI_PO_INFO *        tmpInformation;
    tmpInformation = (PI_PO_INFO *)pAbc->pInformation;
    char       *        ioInformation1, * ioInformation2;
    ioInformation1 = new char[tmpInformation->_f.size() + 1];
    ioInformation2 = new char[tmpInformation->_g.size() + 1];
    ioInformation1[tmpInformation->_f.size()] = '\0';
    ioInformation2[tmpInformation->_g.size()] = '\0';

        for( int i = 0; i < tmpInformation->_f.size() || i < tmpInformation->_g.size(); ++i ) {
            if( i < tmpInformation->_f.size() )
                printf("%6s:                              ", Abc_ObjName((tmpInformation->_f)[i]->thisObj));
            else
                printf("                                     ");
            if( i < tmpInformation->_g.size() )
                printf("%6s:", Abc_ObjName((tmpInformation->_g)[i]->thisObj));
            else
                printf("       ");
            printf("\n");
            for( int j = 0; j < (tmpInformation->_f)[i]->numOfInfluence || j < (tmpInformation->_g)[i]->numOfInfluence; ++j ) {
                if( j < (tmpInformation->_f)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_f)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_f)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_f)[r] ) {
                                ioInformation1[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        if( ioInformation1[r] != '1' ) {
                            ioInformation1[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation1 );
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        ioInformation1[r] = '0';
                    }
                }
                else printf("                                    ");
                if( j < (tmpInformation->_g)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_g)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_g)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_g)[r] ) {
                                ioInformation2[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        if( ioInformation2[r] != '1' ) {
                            ioInformation2[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation2 );
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        ioInformation2[r] = '0';
                    }
                }
                printf("\n");
            }
        }
    delete [] ioInformation1;
    delete [] ioInformation2;

//
    printf("PI supp information for two circuits : \n");
    printf("  cir1   supp     cir2   supp   \n");
    for( int i = 0; i < tmpInformation->_x.size() || i < tmpInformation->_y.size(); ++i ) {
        if( i < tmpInformation->_x.size() ) {
            total1 += (tmpInformation->_x)[i]->numOfInfluence;
            printf("%6s%7d   ", Abc_ObjName((tmpInformation->_x)[i]->thisObj), \
                                 (tmpInformation->_x)[i]->numOfInfluence );
        }
        else printf("                ");
        if( i < tmpInformation->_y.size() ) {
            total2 += (tmpInformation->_y)[i]->numOfInfluence;
            printf("%6s%7d", Abc_ObjName((tmpInformation->_y)[i]->thisObj), \
                              (tmpInformation->_y)[i]->numOfInfluence );
        }
        else printf("             ");
        printf("\n");
    }
    printf(" total %6d    total %6d   \n", total1, total2 );
}